

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::WindGroup> * metaf::WindGroup::parseVariableSector(string *group)

{
  bool bVar1;
  int iVar2;
  Direction *pDVar3;
  undefined1 uVar4;
  optional<metaf::WindGroup> *in_RDI;
  optional<metaf::Direction> oVar5;
  optional<metaf::Direction> end;
  optional<metaf::Direction> begin;
  WindGroup result;
  smatch match;
  WindGroup *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  optional<metaf::WindGroup> *__p;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffee0;
  undefined4 local_118;
  string local_110 [36];
  _Storage<metaf::Direction,_true> local_ec;
  undefined4 local_e4;
  _Storage<metaf::Direction,_true> local_e0;
  undefined4 local_d8;
  string local_d0 [32];
  _Storage<metaf::Direction,_true> local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  Direction local_70;
  Direction local_68;
  undefined4 local_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __p = in_RDI;
  if (parseVariableSector(std::__cxx11::string_const&)::varWindRgx_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&parseVariableSector(std::__cxx11::string_const&)::
                                 varWindRgx_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (in_stack_fffffffffffffee0,(char *)__p,(flag_type)((ulong)in_RDI >> 0x20));
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseVariableSector(std::__cxx11::string_const&)::varWindRgx_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&parseVariableSector(std::__cxx11::string_const&)::varWindRgx_abi_cxx11_);
    }
  }
  __s = &local_38;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (__s,in_stack_fffffffffffffeb8,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                     (match_flag_type)((ulong)in_stack_fffffffffffffea8 >> 0x20));
  if (bVar1) {
    WindGroup((WindGroup *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(in_stack_fffffffffffffea8,CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    oVar5 = Direction::fromDegreesString(__s);
    local_e0 = oVar5.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::Direction>._M_payload;
    local_d8 = CONCAT31(local_d8._1_3_,
                        oVar5.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
                        super__Optional_payload_base<metaf::Direction>._M_engaged);
    local_a8 = local_d8;
    local_b0 = local_e0;
    std::__cxx11::string::~string(local_d0);
    bVar1 = std::optional<metaf::Direction>::has_value((optional<metaf::Direction> *)0x242635);
    if (bVar1) {
      pDVar3 = std::optional<metaf::Direction>::operator*((optional<metaf::Direction> *)0x242692);
      local_70 = *pDVar3;
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(in_stack_fffffffffffffea8,CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0))
      ;
      oVar5 = Direction::fromDegreesString(__s);
      local_ec = oVar5.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
                 super__Optional_payload_base<metaf::Direction>._M_payload;
      uVar4 = oVar5.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
              super__Optional_payload_base<metaf::Direction>._M_engaged;
      local_118 = CONCAT31(local_118._1_3_,uVar4);
      local_e4 = local_118;
      std::__cxx11::string::~string(local_110);
      bVar1 = std::optional<metaf::Direction>::has_value((optional<metaf::Direction> *)0x242706);
      if (bVar1) {
        pDVar3 = std::optional<metaf::Direction>::operator*((optional<metaf::Direction> *)0x242757);
        local_68 = *pDVar3;
        local_a4 = 2;
        std::optional<metaf::WindGroup>::optional<metaf::WindGroup,_true>
                  ((optional<metaf::WindGroup> *)CONCAT17(uVar4,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe98);
      }
      else {
        memcpy(in_RDI,&parseVariableSector::notRecognised,0x6c);
      }
    }
    else {
      memcpy(in_RDI,&parseVariableSector::notRecognised,0x6c);
    }
  }
  else {
    memcpy(in_RDI,&parseVariableSector::notRecognised,0x6c);
  }
  local_3c = 1;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x242797);
  return __p;
}

Assistant:

std::optional<WindGroup> WindGroup::parseVariableSector(const std::string & group) {
	static const std::optional<WindGroup> notRecognised;
	static const std::regex varWindRgx("(\\d\\d0)V(\\d\\d0)");
	static const auto matchVarWindBegin = 1, matchVarWindEnd = 2;

	std::smatch match; 
	if (!std::regex_match(group, match, varWindRgx)) return notRecognised; 
	WindGroup result;
	const auto begin = Direction::fromDegreesString(match.str(matchVarWindBegin));
	if (!begin.has_value()) return notRecognised;
	result.vsecBegin = *begin;
	const auto end = Direction::fromDegreesString(match.str(matchVarWindEnd));
	if (!end.has_value()) return notRecognised;
	result.vsecEnd = *end;
	result.windType = Type::VARIABLE_WIND_SECTOR;
	return result;
}